

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * flatcc_builder_get_direct_buffer(flatcc_builder_t *B,size_t *size_out)

{
  size_t *size_out_local;
  flatcc_builder_t *B_local;
  
  if (B->is_default_emitter == 0) {
    if (size_out != (size_t *)0x0) {
      *size_out = 0;
    }
    B_local = (flatcc_builder_t *)0x0;
  }
  else {
    B_local = (flatcc_builder_t *)
              flatcc_emitter_get_direct_buffer(&B->default_emit_context,size_out);
  }
  return B_local;
}

Assistant:

void *flatcc_builder_get_direct_buffer(flatcc_builder_t *B, size_t *size_out)
{
    if (B->is_default_emitter) {
        return flatcc_emitter_get_direct_buffer(&B->default_emit_context, size_out);
    } else {
        if (size_out) {
            *size_out = 0;
        }
    }
    return 0;
}